

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idx2App.cpp
# Opt level: O3

params * ParseParams(params *__return_storage_ptr__,int Argc,cstr *Argv)

{
  cstr *Val;
  dtype dVar1;
  idx2 *this;
  bool bVar2;
  size_t sVar3;
  ulong uVar4;
  undefined8 extraout_RAX;
  action aVar5;
  metadata *Meta;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  cstr *ppcVar9;
  long lVar10;
  double Eps;
  double dVar11;
  float Eps_1;
  float fVar12;
  error<idx2::err_code> eVar13;
  stref sVar14;
  v3i Last3;
  v3i First3;
  FILE *local_88;
  anon_union_8_2_2df48d06_for_stref_0 local_78;
  int local_70;
  anon_union_12_8_3dedac88_for_v3<int>_1 local_64;
  anon_union_8_2_2df48d06_for_stref_0 local_58;
  uint local_50;
  cstr *local_48;
  anon_union_8_2_2df48d06_for_stref_0 local_40;
  undefined4 local_38;
  
  idx2::params::params(__return_storage_ptr__);
  bVar2 = idx2::OptExists(Argc,Argv,"--encode");
  if (!bVar2) {
    bVar2 = idx2::OptExists(Argc,Argv,"--decode");
    aVar5 = Decode;
    if (bVar2) goto LAB_001074db;
LAB_00107b39:
    ParseParams();
LAB_00107b41:
    ParseParams();
LAB_00107b46:
    ParseParams();
    goto LAB_00107b4b;
  }
  aVar5 = Encode;
LAB_001074db:
  __return_storage_ptr__->Action = aVar5;
  bVar2 = idx2::OptExists(Argc,Argv,"--pause");
  __return_storage_ptr__->Pause = bVar2;
  idx2::OptVal(Argc,Argv,"--out_dir",&__return_storage_ptr__->OutDir);
  idx2::OptVal(Argc,Argv,"--out_file",&__return_storage_ptr__->OutFile);
  bVar2 = idx2::OptExists(Argc,Argv,"--dry");
  __return_storage_ptr__->OutMode = (uint)bVar2 + (uint)bVar2 * 2;
  ppcVar9 = Argv;
  if (__return_storage_ptr__->Action == Decode) {
LAB_00107675:
    bVar2 = idx2::OptVal(Argc,ppcVar9,"--decode",&__return_storage_ptr__->InputFile);
    if (!bVar2) goto LAB_00107b46;
    bVar2 = idx2::OptExists(Argc,ppcVar9,"--first");
    if ((!bVar2) && (bVar2 = idx2::OptExists(Argc,ppcVar9,"--last"), !bVar2)) {
LAB_0010776d:
      idx2::OptVal(Argc,ppcVar9,"--downsampling",&__return_storage_ptr__->DownsamplingFactor3);
      idx2::OptVal(Argc,ppcVar9,"--tolerance",&__return_storage_ptr__->DecodeTolerance);
      idx2::OptVal(Argc,ppcVar9,"--in_dir",&__return_storage_ptr__->InDir);
      bVar2 = idx2::OptExists(Argc,ppcVar9,"--in_dir");
      if (!bVar2) {
        local_40 = (anon_union_8_2_2df48d06_for_stref_0)__return_storage_ptr__->InputFile;
        sVar3 = strlen(local_40.Ptr);
        local_38 = (undefined4)sVar3;
        sVar14 = idx2::GetParentPath((stref *)&local_40);
        local_78 = sVar14.field_0;
        local_70 = sVar14.Size;
        sVar14 = idx2::GetParentPath((stref *)&local_78);
        (__return_storage_ptr__->InDir).field_0 = sVar14.field_0;
        (__return_storage_ptr__->InDir).Size = sVar14.Size;
        bVar2 = idx2::operator==(&__return_storage_ptr__->InDir,(stref *)&local_78);
        if (bVar2) {
          (__return_storage_ptr__->InDir).field_0.Ptr = "./";
          (__return_storage_ptr__->InDir).Size = 2;
        }
      }
      bVar2 = idx2::OptExists(Argc,ppcVar9,"--brick_map");
      if (bVar2) {
        __return_storage_ptr__->OutMode = HashMap;
      }
      bVar2 = idx2::OptExists(Argc,ppcVar9,"--parallel");
      __return_storage_ptr__->ParallelDecode = bVar2;
      return __return_storage_ptr__;
    }
    bVar2 = idx2::OptVal(Argc,ppcVar9,"--first",(v3i *)&local_58);
    if (!bVar2) goto LAB_00107b50;
    bVar2 = idx2::OptVal(Argc,ppcVar9,"--last",(v3i *)&local_64.field_0);
    if (bVar2) {
      (__return_storage_ptr__->DecodeExtent).From =
           (ulong)(local_50 & 0x1fffff) << 0x2a |
           ((ulong)(uint)local_58._4_4_ & 0x1fffff) << 0x15 | (ulong)local_58.Ptr & 0x1fffff;
      (__return_storage_ptr__->DecodeExtent).Dims =
           (ulong)((local_64.field_0.Z - local_50) + 1 & 0x1fffff) << 0x2a |
           (ulong)((local_64.field_0.Y - local_58._4_4_) + 1U & 0x1fffff) << 0x15 |
           (ulong)((local_64.field_0.X - local_58._0_4_) + 1U & 0x1fffff);
      goto LAB_0010776d;
    }
    goto LAB_00107b55;
  }
  if (__return_storage_ptr__->Action != Encode) {
    return __return_storage_ptr__;
  }
  Val = &__return_storage_ptr__->InputFile;
  Meta = (metadata *)Val;
  local_48 = &__return_storage_ptr__->OutDir;
  bVar2 = idx2::OptVal(Argc,Argv,"--encode",Val);
  if (!bVar2) goto LAB_00107b41;
  this = (idx2 *)__return_storage_ptr__->InputFile;
  sVar3 = strlen((char *)this);
  sVar14.field_0.Ptr = (str)(sVar3 & 0xffffffff);
  sVar14._8_8_ = &__return_storage_ptr__->Meta;
  eVar13 = idx2::StrToMetaData(this,sVar14,Meta);
  if (eVar13.Code == NoError) goto LAB_0010799c;
  bVar2 = idx2::OptVal(Argc,Argv,"--name",(__return_storage_ptr__->Meta).Name);
  if (!bVar2) goto LAB_00107b5a;
  bVar2 = idx2::OptVal(Argc,Argv,"--field",(__return_storage_ptr__->Meta).Field);
  if (!bVar2) goto LAB_00107b5f;
  bVar2 = idx2::OptVal(Argc,Argv,"--dims",&(__return_storage_ptr__->Meta).Dims3);
  if (!bVar2) goto LAB_00107b64;
  bVar2 = idx2::OptVal(Argc,Argv,"--type",(str)&local_40);
  if (bVar2) {
    sVar3 = strlen((char *)&local_40);
    local_70 = (int)sVar3;
    ppcVar9 = (cstr *)0x0;
    local_78.Ptr = (str)&local_40;
    do {
      bVar2 = idx2::operator==((stref *)(ppcVar9 + 0x3a2ee),(stref *)&local_78);
      if (bVar2) {
        dVar1 = *(dtype *)(ppcVar9 + 0x3a2f0);
        (__return_storage_ptr__->Meta).DType = dVar1;
        if ((dVar1 & ~uint8) != float32) goto LAB_00107670;
        local_40.ConstPtr = *Val;
        sVar3 = strlen(local_40.Ptr);
        local_38 = (undefined4)sVar3;
        sVar14 = idx2::GetExtension((stref *)&local_40);
        local_78 = sVar14.field_0;
        local_70 = sVar14.Size;
        local_58 = (anon_union_8_2_2df48d06_for_stref_0)0x1b2c4c;
        local_50 = 3;
        bVar2 = idx2::operator==((stref *)&local_78,(stref *)&local_58);
        if (!bVar2) goto LAB_0010799c;
        local_88 = fopen(__return_storage_ptr__->InputFile,"rb");
        idx2::ReadLines<256>((FILE *)local_88,&__return_storage_ptr__->InputFiles);
        if ((__return_storage_ptr__->InputFiles).Size != 0) {
          lVar10 = 0;
          lVar8 = 0;
          uVar7 = 0;
          goto LAB_00107914;
        }
        uVar4 = 0;
        goto LAB_00107961;
      }
      ppcVar9 = ppcVar9 + 3;
    } while (ppcVar9 != (cstr *)0xf0);
    (__return_storage_ptr__->Meta).DType = __Invalid__;
LAB_00107670:
    ParseParams();
    goto LAB_00107675;
  }
  goto LAB_00107b69;
  while( true ) {
    lVar8 = lVar8 + 1;
    lVar10 = lVar10 + 0x101;
    uVar7 = uVar4;
    if (lVar8 == (__return_storage_ptr__->InputFiles).Size) break;
LAB_00107914:
    local_78.Ptr = (str)((__return_storage_ptr__->InputFiles).Buffer.Data + lVar10);
    sVar3 = strlen(local_78.Ptr);
    local_70 = (int)sVar3;
    uVar4 = idx2::GetFileSize((stref *)&local_78);
    if (uVar7 != uVar4 && lVar8 != 0) {
      ParseParams();
      goto LAB_00107b39;
    }
  }
LAB_00107961:
  uVar6 = (ulong)(__return_storage_ptr__->Meta).DType;
  uVar7 = 0xffffffffffffffff;
  if (uVar6 < 10) {
    uVar7 = *(ulong *)(&DAT_001b3018 + uVar6 * 8);
  }
  if ((uVar7 & uVar4) != 0) goto LAB_00107b6e;
  if (local_88 != (FILE *)0x0) {
    fclose(local_88);
  }
LAB_0010799c:
  if ((__return_storage_ptr__->Meta).DType != __Invalid__) {
    idx2::OptVal(Argc,Argv,"--brick_size",&__return_storage_ptr__->BrickDims3);
    idx2::OptVal(Argc,Argv,"--num_levels",&__return_storage_ptr__->NLevels);
    idx2::OptVal(Argc,Argv,"--tolerance",&__return_storage_ptr__->Tolerance);
    ppcVar9 = local_48;
    if (0.0 < (double)__return_storage_ptr__->Tolerance) goto LAB_00107a7e;
    dVar1 = (__return_storage_ptr__->Meta).DType;
    if (dVar1 == float32) {
      fVar12 = 0.5;
      do {
        do {
          fVar12 = fVar12 * 0.5;
        } while (fVar12 + 1.0 != 1.0);
      } while (NAN(fVar12 + 1.0));
      dVar11 = (double)fVar12;
LAB_00107a6a:
      __return_storage_ptr__->Tolerance = (f64)dVar11;
    }
    else if (dVar1 == float64) {
      dVar11 = 0.5;
      do {
        do {
          dVar11 = dVar11 * 0.5;
        } while (dVar11 + 1.0 != 1.0);
      } while (NAN(dVar11 + 1.0));
      goto LAB_00107a6a;
    }
    printf("tolerance = %.16f (machine epsilon)\n");
LAB_00107a7e:
    idx2::OptVal(Argc,Argv,"--bit_planes_per_chunk",&__return_storage_ptr__->BitPlanesPerChunk);
    idx2::OptVal(Argc,Argv,"--bit_planes_per_file",&__return_storage_ptr__->BitPlanesPerFile);
    idx2::OptVal(Argc,Argv,"--bricks_per_chunk",&__return_storage_ptr__->BricksPerChunk);
    idx2::OptVal(Argc,Argv,"--chunks_per_file",&__return_storage_ptr__->ChunksPerFile);
    idx2::OptVal(Argc,Argv,"--files_per_dir",&__return_storage_ptr__->FilesPerDir);
    idx2::OptVal(Argc,Argv,"--version",&__return_storage_ptr__->Version);
    idx2::OptVal(Argc,Argv,"--out_dir",ppcVar9);
    return __return_storage_ptr__;
  }
LAB_00107b4b:
  ParseParams();
LAB_00107b50:
  ParseParams();
LAB_00107b55:
  ParseParams();
LAB_00107b5a:
  ParseParams();
LAB_00107b5f:
  ParseParams();
LAB_00107b64:
  ParseParams();
LAB_00107b69:
  ParseParams();
LAB_00107b6e:
  ParseParams();
  if (local_88 != (FILE *)0x0) {
    fclose(local_88);
  }
  _Unwind_Resume(extraout_RAX);
}

Assistant:

params
ParseParams(int Argc, cstr* Argv)
{
  params P;

  P.Action = OptExists(Argc, Argv, "--encode")   ? action::Encode
             : OptExists(Argc, Argv, "--decode") ? P.Action = action::Decode
                                                 : action::__Invalid__;

  idx2_ExitIf(P.Action == action::__Invalid__,
              "Provide either --encode or --decode\n"
              "Example 1: --encode /Users/abc/Miranda-Density-[384-384-256]-Float64.raw\n"
              "Example 2: --encode Miranda-Density-[384-384-256]-Float64.raw\n"
              "Example 3: --decode /Users/abc/Miranda/Density.idx2\n"
              "Example 4: --decode Miranda/Density.idx2\n");

  //// Parse the input file (--input)
  //idx2_ExitIf(!OptVal(Argc, Argv, "--input", &P.InputFile),
  //            "Provide --input\n"
  //            "Example: --input /Users/abc/MIRANDA-DENSITY-[384-384-256]-Float64.raw\n");

  // Parse the pause option (--pause): wait for keyboard input at the end
  P.Pause = OptExists(Argc, Argv, "--pause");

  // Parse the optional output directory (--out_dir)
  OptVal(Argc, Argv, "--out_dir", &P.OutDir);
  // Parse the optional output file (--out_file)
  OptVal(Argc, Argv, "--out_file", &P.OutFile);

  // Parse the dry run option (--dry): if enabled, skip writing the output file
  P.OutMode =
    OptExists(Argc, Argv, "--dry") ? params::out_mode::NoOutput : params::out_mode::RegularGridFile;

  // Perform parsing depending on the action
  if (P.Action == action::Encode)
    ParseEncodeOptions(Argc, Argv, &P);
  else if (P.Action == action::Decode)
    ParseDecodeOptions(Argc, Argv, &P);

  return P;
}